

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O0

void __thiscall soplex::LPRowBase<double>::LPRowBase(LPRowBase<double> *this,int defDim)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  DSVectorBase<double> *unaff_retaddr;
  undefined8 *puVar2;
  
  *in_RDI = 0;
  puVar2 = in_RDI;
  puVar1 = (undefined8 *)infinity();
  in_RDI[1] = *puVar1;
  in_RDI[2] = 0;
  DSVectorBase<double>::DSVectorBase(unaff_retaddr,(int)((ulong)puVar2 >> 0x20));
  return;
}

Assistant:

explicit LPRowBase(int defDim = 0)
      : left(0), right(R(infinity)), object(0), vec(defDim)
   {
      assert(isConsistent());
   }